

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O2

void __thiscall
SourceMapTest_SourceMappingSingleSegment_Test::TestBody
          (SourceMapTest_SourceMappingSingleSegment_Test *this)

{
  string *sourceMap_00;
  char *in_R9;
  undefined1 local_90 [8];
  optional<wasm::Function::DebugLocation> loc;
  string sourceMap;
  AssertionResult gtest_ar_;
  Message local_28;
  AssertHelper local_20;
  
  sourceMap_00 = (string *)
                 ((long)&loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
                         _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                         _M_payload._M_value.symbolNameIndex.
                         super__Optional_base<unsigned_int,_true,_true> + 4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)sourceMap_00,
             "\n      {\n          \"version\": 3,\n          \"sources\": [],\n          \"sourcesContent\": [],\n          \"names\": [],\n          \"mappings\": \"A\"\n      }\n  "
             ,(allocator<char> *)&gtest_ar_.message_);
  SourceMapTest::parseMap(&this->super_SourceMapTest,sourceMap_00);
  ::wasm::SourceMapReader::readDebugLocationAt((ulong)local_90);
  sourceMap.field_2._M_local_buf[8] =
       loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._12_1_ ^ 1;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._12_1_ != '\0') {
    testing::Message::Message(&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_.message_,(internal *)(sourceMap.field_2._M_local_buf + 8),
               (AssertionResult *)"loc.has_value()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/source-map.cpp"
               ,0x54,(char *)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
    testing::internal::AssertHelper::operator=(&local_20,&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    if (local_28.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_28.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_);
  std::__cxx11::string::~string
            ((string *)
             ((long)&loc.super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value
                     .symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> + 4));
  return;
}

Assistant:

TEST_F(SourceMapTest, SourceMappingSingleSegment) {
  // A single-segment mapping starting at offset 0.
  std::string sourceMap = R"(
      {
          "version": 3,
          "sources": [],
          "sourcesContent": [],
          "names": [],
          "mappings": "A"
      }
  )";
  parseMap(sourceMap);

  auto loc = reader->readDebugLocationAt(0);
  EXPECT_FALSE(loc.has_value());
}